

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser * init_parse_names(void)

{
  parser *p_00;
  undefined4 *v;
  names_parse *n;
  parser *p;
  
  p_00 = parser_new();
  v = (undefined4 *)mem_zalloc(0x28);
  *v = 0;
  parser_setpriv(p_00,v);
  parser_reg(p_00,"section uint section",parse_names_section);
  parser_reg(p_00,"word str name",parse_names_word);
  return p_00;
}

Assistant:

static struct parser *init_parse_names(void) {
	struct parser *p = parser_new();
	struct names_parse *n = mem_zalloc(sizeof *n);
	n->section = 0;
	parser_setpriv(p, n);
	parser_reg(p, "section uint section", parse_names_section);
	parser_reg(p, "word str name", parse_names_word);
	return p;
}